

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-info.cpp
# Opt level: O2

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char cVar1;
  char *__s1;
  CommandOptions *pCVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char *__format;
  int iVar6;
  allocator<char> local_69;
  CommandOptions *local_68;
  char **local_60;
  _List_node_base *local_58;
  value_type local_50;
  
  this->error_flag = true;
  this->version_flag = false;
  this->help_flag = false;
  this->verbose_flag = false;
  local_58 = (_List_node_base *)&this->filenames;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = local_58;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = local_58;
  this->max_bitrate = 0.0;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->showindex_flag = false;
  this->showheader_flag = false;
  this->stereo_image_flag = false;
  this->showid_flag = false;
  this->showdescriptor_flag = false;
  this->showcoding_flag = false;
  this->showrate_flag = false;
  this->max_bitrate_flag = false;
  iVar6 = 1;
  local_68 = this;
  local_60 = argv;
  do {
    if (argc <= iVar6) {
      if ((local_68->help_flag == false) && (local_68->version_flag == false)) {
        if ((((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58->_M_next)->_M_impl)._M_node.super__List_node_base._M_next == local_58) {
          fputs("At least one filename argument is required.\n",_stderr);
        }
        else {
          local_68->error_flag = false;
        }
      }
      return;
    }
    __s1 = argv[iVar6];
    iVar3 = strcmp(__s1,"-help");
    pCVar2 = local_68;
    if (iVar3 == 0) {
      local_68->help_flag = true;
    }
    else if (*__s1 == '-') {
      cVar1 = __s1[1];
      iVar3 = isalpha((int)cVar1);
      argv = local_60;
      if ((9 < (int)cVar1 - 0x30U && iVar3 == 0) || (__s1[2] != '\0')) {
        __format = "Unrecognized argument: %s\n";
        goto LAB_0010b868;
      }
      switch(cVar1) {
      case 'c':
        pCVar2->showcoding_flag = true;
        break;
      case 'd':
        pCVar2->showdescriptor_flag = true;
        break;
      case 'e':
      case 'f':
      case 'g':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'o':
      case 'p':
      case 'q':
      case 's':
      case 'u':
switchD_0010b713_caseD_65:
        __format = "Unrecognized option: %s\n";
LAB_0010b868:
        fprintf(_stderr,__format,__s1);
        return;
      case 'h':
        pCVar2->help_flag = true;
        break;
      case 'i':
        pCVar2->showid_flag = true;
        break;
      case 'n':
        pCVar2->showindex_flag = true;
        break;
      case 'r':
        pCVar2->showrate_flag = true;
        break;
      case 't':
        iVar6 = iVar6 + 1;
        if ((argc <= iVar6) || (*local_60[iVar6] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x74);
          return;
        }
        lVar4 = strtol(local_60[iVar6],(char **)0x0,10);
        lVar5 = -lVar4;
        if (0 < lVar4) {
          lVar5 = lVar4;
        }
        local_68->max_bitrate = (double)lVar5;
        local_68->max_bitrate_flag = true;
        break;
      case 'v':
        pCVar2->verbose_flag = true;
        break;
      default:
        if (cVar1 == 'V') {
          pCVar2->version_flag = true;
        }
        else if (cVar1 == 'H') {
          pCVar2->showheader_flag = true;
        }
        else {
          if (cVar1 != '3') goto switchD_0010b713_caseD_65;
          pCVar2->stereo_image_flag = true;
        }
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s1,&local_69);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_58,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), version_flag(false), help_flag(false), verbose_flag(false),
    showindex_flag(), showheader_flag(), stereo_image_flag(false),
    showid_flag(false), showdescriptor_flag(false), showcoding_flag(false),
    showrate_flag(false), max_bitrate_flag(false), max_bitrate(0.0)
  {
    for ( int i = 1; i < argc; ++i )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }

	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case '3': stereo_image_flag = true; break;
	      case 'c': showcoding_flag = true; break;
	      case 'd': showdescriptor_flag = true; break;
	      case 'H': showheader_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'i': showid_flag = true; break;
	      case 'n': showindex_flag = true; break;
	      case 'r': showrate_flag = true; break;

	      case 't':
		TEST_EXTRA_ARG(i, 't');
		max_bitrate = Kumu::xabs(strtol(argv[i], 0, 10));
		max_bitrate_flag = true;
		break;

	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    if ( argv[i][0] != '-' )
	      {
		filenames.push_back(argv[i]);
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }
	  }
      }

    if ( help_flag || version_flag )
      return;

    if ( filenames.empty() )
      {
	fputs("At least one filename argument is required.\n", stderr);
	return;
      }

    error_flag = false;
  }